

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall
ON_BinaryArchive::End3dmTable(ON_BinaryArchive *this,ON_3dmArchiveTableType table,bool bSuccess)

{
  uint *puVar1;
  ON_3dmTableStatusLink *pOVar2;
  int iVar3;
  undefined7 in_register_00000011;
  char cVar4;
  
  iVar3 = (int)CONCAT71(in_register_00000011,bSuccess);
  if (iVar3 == 0) {
    this->m_critical_error_count = this->m_critical_error_count + 1;
    pOVar2 = this->m_3dm_table_status_list;
    if ((pOVar2 != (ON_3dmTableStatusLink *)0x0) &&
       (this->m_3dm_active_table == (pOVar2->m_table_status).m_table_type)) {
      puVar1 = &(pOVar2->m_table_status).m_critical_error_count;
      *puVar1 = *puVar1 + 1;
    }
  }
  if ((this->m_chunk).m_count == 0) {
    if (this->m_3dm_active_table != table) {
      iVar3 = 0;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,0x1dbb,"","End3dmTable() table does not match the active table setting.");
    }
    cVar4 = (char)iVar3;
    if (this->m_3dm_previous_table < table) {
      this->m_3dm_previous_table = table;
    }
    else if (this->m_3dm_previous_table != user_table || table != user_table) {
      cVar4 = '\0';
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,0x1dc7,"","3dm archive tables read/written in incorrect order.");
    }
    if (bSuccess && cVar4 == '\0') {
      this->m_critical_error_count = this->m_critical_error_count + 1;
      pOVar2 = this->m_3dm_table_status_list;
      if ((pOVar2 != (ON_3dmTableStatusLink *)0x0) &&
         (this->m_3dm_active_table == (pOVar2->m_table_status).m_table_type)) {
        puVar1 = &(pOVar2->m_table_status).m_critical_error_count;
        *puVar1 = *puVar1 + 1;
      }
    }
    pOVar2 = this->m_3dm_table_status_list;
    if ((pOVar2 != (ON_3dmTableStatusLink *)0x0) &&
       (this->m_3dm_active_table == (pOVar2->m_table_status).m_table_type)) {
      (pOVar2->m_table_status).m_state = Finished;
    }
    this->m_3dm_active_table = Unset;
  }
  else {
    if (bSuccess) {
      this->m_critical_error_count = this->m_critical_error_count + 1;
      pOVar2 = this->m_3dm_table_status_list;
      if ((pOVar2 != (ON_3dmTableStatusLink *)0x0) &&
         (this->m_3dm_active_table == (pOVar2->m_table_status).m_table_type)) {
        puVar1 = &(pOVar2->m_table_status).m_critical_error_count;
        *puVar1 = *puVar1 + 1;
      }
    }
    cVar4 = '\0';
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x1dda,"","End3dmTable() called while chunks are open.");
  }
  if ((cVar4 == '\0') && (this->m_3dm_first_failed_table == Unset)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x1de0,"","Reading or writing 3dm archive first failure.");
    this->m_3dm_first_failed_table = table;
  }
  return (bool)cVar4;
}

Assistant:

bool ON_BinaryArchive::End3dmTable(
  ON_3dmArchiveTableType table,
  bool bSuccess
  )
{
  bool rc = bSuccess;

  bool bReportError = true;
  if (false == bSuccess)
  {
    Internal_ReportCriticalError();
    bReportError = false;
  }

  if (0 == m_chunk.Count())
  {
    if (table != Active3dmTable())
    {
      ON_ERROR("End3dmTable() table does not match the active table setting.");
      rc = false;
    }
    if (static_cast<unsigned int>(table) > static_cast<unsigned int>(Previous3dmTable()))
      m_3dm_previous_table = table;
    else
    {
      if (
        ON_3dmArchiveTableType::user_table != table
        || ON_3dmArchiveTableType::user_table != Previous3dmTable()
        )
      {
        ON_ERROR("3dm archive tables read/written in incorrect order.");
        rc = false;
      }
    }
    if (false == rc && bReportError)
    {
      Internal_ReportCriticalError();
      bReportError = false;
    }
    if ( nullptr != m_3dm_table_status_list && m_3dm_active_table == m_3dm_table_status_list->m_table_status.m_table_type )
      m_3dm_table_status_list->m_table_status.m_state = ON_3dmArchiveTableStatus::TableState::Finished;
    m_3dm_active_table = ON_3dmArchiveTableType::Unset;
  }
  else
  {
    if (bReportError)
    {
      Internal_ReportCriticalError();
    }
    ON_ERROR("End3dmTable() called while chunks are open.");
    rc = false;
  }

  if (false == rc && ON_3dmArchiveTableType::Unset == m_3dm_first_failed_table)
  {
    ON_ERROR("Reading or writing 3dm archive first failure.");
    m_3dm_first_failed_table = table;
  }
  return rc;
}